

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O2

void logSigned<int>(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  cx_string<4UL> cVar1;
  SessionWriter *pSVar2;
  __atomic_base<unsigned_long> _Var3;
  nanoseconds clock;
  int b;
  int a;
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  int local_f8 [3];
  char local_ec;
  int local_e4;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  local_f8[1] = 0xffffffec;
  local_f8[0] = 0x1e;
  pSVar2 = binlog::default_thread_local_writer();
  if ((pSVar2->_session->_minSeverity)._M_i < 0x81) {
    if (logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      this = pSVar2->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_f9);
      std::__cxx11::string::string(local_b0,"logSigned",&local_fa);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_fb);
      local_70 = 0xc;
      std::__cxx11::string::string(local_68,"{} {} {} {}",&local_fc);
      local_e4 = -0x28;
      cVar1 = binlog::detail::concatenated_tags<char_const(&)[12],int&,int_const&,int_const&,int>
                        ((char (*) [12])"{} {} {} {}",local_f8 + 1,local_f8,local_f8,&local_e4);
      local_f8[2] = cVar1._data._0_4_;
      local_ec = cVar1._data[4];
      std::__cxx11::string::string(local_48,(char *)(local_f8 + 2),&local_fd);
      _Var3._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar2 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    local_f8[2] = 0xffffffd8;
    binlog::SessionWriter::addEvent<int&,int_const&,int_const&,int>
              (pSVar2,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               local_f8 + 1,local_f8,local_f8,local_f8 + 2);
  }
  return;
}

Assistant:

void logSigned()
{
  T a = -20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(-40));
}